

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

int embree::main(int argc,char **argv)

{
  ParseStream *this;
  CommandLineStream *this_00;
  allocator local_a3;
  allocator local_a2;
  allocator local_a1;
  Ref<embree::Stream<int>_> local_a0;
  Ref<embree::ParseStream> local_98;
  string local_90;
  string local_70;
  string local_50;
  
  g_device = (RTCDevice)rtcNewDevice(0);
  this = (ParseStream *)operator_new(0x48);
  this_00 = (CommandLineStream *)operator_new(0x80);
  std::__cxx11::string::string((string *)&local_90,"command line",&local_a1);
  CommandLineStream::CommandLineStream(this_00,argc,argv,&local_90);
  local_a0.ptr = (Stream<int> *)this_00;
  (*(this_00->super_Stream<int>).super_RefCount._vptr_RefCount[2])(this_00);
  std::__cxx11::string::string((string *)&local_50,"\n\t\r ",&local_a2);
  std::__cxx11::string::string((string *)&local_70,"",&local_a3);
  ParseStream::ParseStream(this,&local_a0,&local_50,&local_70,false);
  (*(this->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[2])(this);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if ((CommandLineStream *)local_a0.ptr != (CommandLineStream *)0x0) {
    (*(((Stream<int> *)&(local_a0.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  std::__cxx11::string::~string((string *)&local_90);
  local_98.ptr = this;
  (*(this->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[2])(this);
  FileName::FileName((FileName *)&local_90);
  parseCommandLine(&local_98,(FileName *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  (*(this->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this);
  rtcReleaseDevice(g_device);
  g_device = (RTCDevice)0x0;
  (*(this->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this);
  return 0;
}

Assistant:

int main(int argc, char** argv) 
  {
    g_device = rtcNewDevice(nullptr);
      
    /* create stream for parsing */
    Ref<ParseStream> stream = new ParseStream(new CommandLineStream(argc, argv));

    /* parse command line */  
    parseCommandLine(stream, FileName());

    rtcReleaseDevice(g_device); g_device = nullptr;
    return 0;
  }